

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedPipelineRenderer.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3MaterialSolidCB::OnSetConstants
          (COpenGL3MaterialSolidCB *this,IMaterialRendererServices *services,s32 userData)

{
  undefined4 uVar1;
  CMatrix4<float> *this_00;
  float *pfVar2;
  long *in_RSI;
  long in_RDI;
  matrix4 Matrix;
  IVideoDriver *driver;
  s32 in_stack_000001b4;
  IMaterialRendererServices *in_stack_000001b8;
  COpenGL3MaterialBaseCB *in_stack_000001c0;
  float in_stack_ffffffffffffffd4;
  CMatrix4<float> *in_stack_ffffffffffffffd8;
  
  COpenGL3MaterialBaseCB::OnSetConstants(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
  this_00 = (CMatrix4<float> *)(**(code **)(*in_RSI + 0x58))();
  if ((*(byte *)(in_RDI + 0xb4) & 1) != 0) {
    uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,"uTMatrix0");
    *(undefined4 *)(in_RDI + 0xb8) = uVar1;
    uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,"uAlphaRef");
    *(undefined4 *)(in_RDI + 0xbc) = uVar1;
    uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,"uTextureUsage0");
    *(undefined4 *)(in_RDI + 0xc0) = uVar1;
    uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,"uTextureUnit0");
    *(undefined4 *)(in_RDI + 0xc4) = uVar1;
    *(undefined1 *)(in_RDI + 0xb4) = 0;
  }
  (**(code **)(*(long *)this_00->M + 0x38))(this_00,3);
  core::CMatrix4<float>::CMatrix4
            (this_00,in_stack_ffffffffffffffd8,(eConstructor)in_stack_ffffffffffffffd4);
  uVar1 = *(undefined4 *)(in_RDI + 0xb8);
  pfVar2 = core::CMatrix4<float>::pointer((CMatrix4<float> *)&stack0xffffffffffffffa0);
  (**(code **)(*in_RSI + 0x40))(in_RSI,uVar1,pfVar2,0x10);
  (**(code **)(*in_RSI + 0x40))(in_RSI,*(undefined4 *)(in_RDI + 0xbc),in_RDI + 200,1);
  (**(code **)(*in_RSI + 0x48))(in_RSI,*(undefined4 *)(in_RDI + 0xc0),in_RDI + 0xcc,1);
  (**(code **)(*in_RSI + 0x48))(in_RSI,*(undefined4 *)(in_RDI + 0xc4),in_RDI + 0xd0,1);
  return;
}

Assistant:

void COpenGL3MaterialSolidCB::OnSetConstants(IMaterialRendererServices *services, s32 userData)
{
	COpenGL3MaterialBaseCB::OnSetConstants(services, userData);

	IVideoDriver *driver = services->getVideoDriver();

	if (FirstUpdate) {
		TMatrix0ID = services->getVertexShaderConstantID("uTMatrix0");
		AlphaRefID = services->getVertexShaderConstantID("uAlphaRef");
		TextureUsage0ID = services->getVertexShaderConstantID("uTextureUsage0");
		TextureUnit0ID = services->getVertexShaderConstantID("uTextureUnit0");

		FirstUpdate = false;
	}

	core::matrix4 Matrix = driver->getTransform(ETS_TEXTURE_0);
	services->setPixelShaderConstant(TMatrix0ID, Matrix.pointer(), 16);

	services->setPixelShaderConstant(AlphaRefID, &AlphaRef, 1);
	services->setPixelShaderConstant(TextureUsage0ID, &TextureUsage0, 1);
	services->setPixelShaderConstant(TextureUnit0ID, &TextureUnit0, 1);
}